

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O1

void __thiscall duckdb::roaring::RoaringAnalyzeState::FlushContainer(RoaringAnalyzeState *this)

{
  pointer *ppCVar1;
  ushort count;
  BlockManager *pBVar2;
  iterator __position;
  ContainerMetadata CVar3;
  idx_t iVar4;
  idx_t iVar5;
  ContainerMetadataCollection *this_00;
  ulong uVar6;
  bool bVar7;
  ContainerMetadata metadata;
  undefined8 uStack_28;
  
  count = this->count;
  uStack_28 = (ulong)count;
  if (count != 0) {
    this_00 = (ContainerMetadataCollection *)(ulong)count;
    CVar3 = ContainerMetadata::CreateMetadata
                      (count,this->zero_count,this->one_count,this->run_count);
    uStack_28 = CONCAT44(CVar3,(undefined4)uStack_28);
    bVar7 = CVar3.container_type == RUN_CONTAINER;
    iVar4 = (ulong)!bVar7 + (this->metadata_collection).arrays_in_segment;
    iVar5 = (ulong)bVar7 + (this->metadata_collection).runs_in_segment;
    iVar4 = ContainerMetadataCollection::GetMetadataSize(this_00,iVar5 + iVar4,iVar5,iVar4);
    this->metadata_size = iVar4;
    if (uStack_28._4_1_ == '\0') {
      uVar6 = (ulong)((uint)uStack_28._6_2_ * 4);
      if (3 < uStack_28._6_2_) {
        uVar6 = (ulong)uStack_28._6_2_ * 2 + 8;
      }
    }
    else if (uStack_28._4_1_ == '\x02') {
      uVar6 = (ulong)(this->count >> 3 & 0xfffffff8);
    }
    else {
      uVar6 = (ulong)((uint)uStack_28._6_2_ + (uint)uStack_28._6_2_);
      if (7 < uStack_28._6_2_) {
        uVar6 = (ulong)uStack_28._6_2_ + 8;
      }
    }
    iVar5 = uVar6 + this->data_size;
    this->data_size = iVar5;
    uVar6 = iVar5 + iVar4;
    pBVar2 = (this->super_AnalyzeState).info.block_manager;
    iVar4 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
    iVar5 = optional_idx::GetIndex(&pBVar2->block_header_size);
    if ((iVar4 - (iVar5 + uVar6) < uVar6) && (this->current_count != 0)) {
      iVar4 = this->metadata_size;
      iVar5 = this->data_size;
      (this->metadata_collection).count_in_segment = 0;
      (this->metadata_collection).runs_in_segment = 0;
      (this->metadata_collection).arrays_in_segment = 0;
      this->total_size = this->total_size + iVar4 + iVar5;
      this->current_count = 0;
      this->data_size = 0;
      this->metadata_size = 0;
      this->segment_count = this->segment_count + 1;
    }
    __position._M_current =
         (this->container_metadata).
         super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
         .
         super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->container_metadata).
        super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
        .
        super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<duckdb::roaring::ContainerMetadata,std::allocator<duckdb::roaring::ContainerMetadata>>
      ::_M_realloc_insert<duckdb::roaring::ContainerMetadata_const&>
                ((vector<duckdb::roaring::ContainerMetadata,std::allocator<duckdb::roaring::ContainerMetadata>>
                  *)&this->container_metadata,__position,(ContainerMetadata *)((long)&uStack_28 + 4)
                );
    }
    else {
      *__position._M_current = uStack_28._4_4_;
      ppCVar1 = &(this->container_metadata).
                 super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
                 .
                 super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar1 = *ppCVar1 + 1;
    }
    ContainerMetadataCollection::AddMetadata(&this->metadata_collection,uStack_28._4_4_);
    this->current_count = this->current_count + (ulong)this->count;
    this->count = 0;
    *(undefined4 *)((long)&this->zero_count + 1) = 0;
    this->one_count = 0;
    this->zero_count = 0;
  }
  return;
}

Assistant:

void RoaringAnalyzeState::FlushContainer() {
	if (!count) {
		return;
	}
	auto metadata = GetResult();
	idx_t runs_count = metadata_collection.GetRunContainerCount();
	idx_t arrays_count = metadata_collection.GetArrayAndBitsetContainerCount();

	if (metadata.IsRun()) {
		runs_count++;
	} else {
		arrays_count++;
	}

	metadata_size = metadata_collection.GetMetadataSize(runs_count + arrays_count, runs_count, arrays_count);

	data_size += metadata.GetDataSizeInBytes(count);
	if (!HasEnoughSpaceInSegment(metadata_size + data_size)) {
		FlushSegment();
	}
	container_metadata.push_back(metadata);
	metadata_collection.AddMetadata(metadata);
	current_count += count;

	// Reset the container analyze state
	one_count = 0;
	zero_count = 0;
	run_count = 0;
	last_bit_set = false;
	count = 0;
}